

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_qcache.c
# Opt level: O1

ares_status_t
ares_qcache_fetch(ares_channel_t *channel,ares_timeval_t *now,ares_dns_record_t *dnsrec,
                 ares_dns_record_t **dnsrec_resp)

{
  char *key;
  void *pvVar1;
  ares_status_t aVar2;
  
  aVar2 = ARES_EFORMERR;
  if (dnsrec_resp != (ares_dns_record_t **)0x0 &&
      (dnsrec != (ares_dns_record_t *)0x0 && channel != (ares_channel_t *)0x0)) {
    if (channel->qcache == (ares_qcache_t *)0x0) {
      aVar2 = ARES_ENOTFOUND;
    }
    else {
      ares_qcache_expire(channel->qcache,now);
      key = ares_qcache_calc_key(dnsrec);
      if (key == (char *)0x0) {
        aVar2 = ARES_ENOMEM;
      }
      else {
        pvVar1 = ares_htable_strvp_get_direct(channel->qcache->cache,key);
        if (pvVar1 == (void *)0x0) {
          aVar2 = ARES_ENOTFOUND;
        }
        else {
          ares_dns_record_ttl_decrement
                    (*(ares_dns_record_t **)((long)pvVar1 + 8),
                     (int)now->sec - *(int *)((long)pvVar1 + 0x18));
          *dnsrec_resp = *(ares_dns_record_t **)((long)pvVar1 + 8);
          aVar2 = ARES_SUCCESS;
        }
      }
      ares_free(key);
    }
  }
  return aVar2;
}

Assistant:

ares_status_t ares_qcache_fetch(ares_channel_t           *channel,
                                const ares_timeval_t     *now,
                                const ares_dns_record_t  *dnsrec,
                                const ares_dns_record_t **dnsrec_resp)
{
  char                *key = NULL;
  ares_qcache_entry_t *entry;
  ares_status_t        status = ARES_SUCCESS;

  if (channel == NULL || dnsrec == NULL || dnsrec_resp == NULL) {
    return ARES_EFORMERR;
  }

  if (channel->qcache == NULL) {
    return ARES_ENOTFOUND;
  }

  ares_qcache_expire(channel->qcache, now);

  key = ares_qcache_calc_key(dnsrec);
  if (key == NULL) {
    status = ARES_ENOMEM; /* LCOV_EXCL_LINE: OutOfMemory */
    goto done;            /* LCOV_EXCL_LINE: OutOfMemory */
  }

  entry = ares_htable_strvp_get_direct(channel->qcache->cache, key);
  if (entry == NULL) {
    status = ARES_ENOTFOUND;
    goto done;
  }

  ares_dns_record_ttl_decrement(entry->dnsrec,
                                (unsigned int)(now->sec - entry->insert_ts));

  *dnsrec_resp = entry->dnsrec;

done:
  ares_free(key);
  return status;
}